

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void input_binary(_Bool *target,size_t length,char *prompt)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  _Bool *p_Var5;
  _Bool _Var6;
  char input [1024];
  undefined8 uStack_440;
  char local_438 [1032];
  
  do {
    uStack_440 = (code *)0x10128a;
    printf("%s",prompt);
    uStack_440 = (code *)0x101297;
    pcVar3 = fgets(local_438,(int)length + 2,_stdin);
    if (pcVar3 == (char *)0x0) {
      uStack_440 = sum_binary;
      exit(1);
    }
    if (length == 0) {
      return;
    }
    uVar4 = 1;
    p_Var5 = target + length;
    bVar2 = true;
    do {
      p_Var5 = p_Var5 + -1;
      _Var6 = false;
      if (local_438[uVar4 - 1] == '0') {
LAB_001012bf:
        *p_Var5 = _Var6;
        bVar1 = bVar2;
      }
      else {
        bVar1 = false;
        if (local_438[uVar4 - 1] == '1') {
          _Var6 = true;
          goto LAB_001012bf;
        }
      }
    } while ((uVar4 < length) && (uVar4 = uVar4 + 1, bVar2 = bVar1, bVar1));
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void input_binary(bool* target, const size_t length, const char* prompt) {
  char input[1024]; // should be plenty enough

  bool is_valid = false;
  while (!is_valid) {
    printf("%s", prompt);
    if (!fgets(input, (int)(length + 2), stdin)) exit(1);

    is_valid = true;

    for (size_t n = 0; n < length && is_valid; n++) {
      if (input[n] == '0') target[length - n - 1] = false;
      else if (input[n] == '1') target[length - n - 1] = true;
      else is_valid = false;
    }
  }
}